

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int xptrDocTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  glob_t globbuf;
  char pattern [500];
  char result [500];
  glob64_t local_470;
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcVar3 = "xptr";
  if (options == -1) {
    pcVar3 = "xptr-xp1";
  }
  xpathDocument = (xmlDocPtr)xmlReadFile(filename,0,10);
  if (xpathDocument == (xmlDocPtr)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
    iVar5 = -1;
  }
  else {
    pcVar2 = baseFilename(filename);
    iVar5 = 0;
    iVar1 = snprintf(local_428,499,"./test/XPath/%s/%s*",pcVar3,pcVar2);
    if (0x1f2 < iVar1) {
      local_235 = 0;
    }
    local_470.gl_offs = 0;
    glob64(local_428,8,(__errfunc *)0x0,&local_470);
    if (local_470.gl_pathc != 0) {
      iVar5 = 0;
      uVar4 = 0;
      do {
        pcVar2 = baseFilename(local_470.gl_pathv[uVar4]);
        iVar1 = snprintf(local_228,499,"result/XPath/%s/%s",pcVar3,pcVar2);
        if (0x1f2 < iVar1) {
          local_35 = 0;
        }
        iVar1 = xpathCommonTest(local_470.gl_pathv[uVar4],local_228,1,0);
        if (iVar1 != 0) {
          iVar5 = iVar1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_470.gl_pathc);
    }
    globfree64(&local_470);
    xmlFreeDoc(xpathDocument);
  }
  return iVar5;
}

Assistant:

static int
xptrDocTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options) {

    char pattern[500];
    char result[500];
    glob_t globbuf;
    size_t i;
    int ret = 0, res;
    const char *subdir = options == -1 ? "xptr-xp1" : "xptr";

    xpathDocument = xmlReadFile(filename, NULL,
                                XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (xpathDocument == NULL) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    res = snprintf(pattern, 499, "./test/XPath/%s/%s*",
            subdir, baseFilename(filename));
    if (res >= 499)
        pattern[499] = 0;
    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        res = snprintf(result, 499, "result/XPath/%s/%s",
	         subdir, baseFilename(globbuf.gl_pathv[i]));
        if (res >= 499)
            result[499] = 0;
	res = xpathCommonTest(globbuf.gl_pathv[i], &result[0], 1, 0);
	if (res != 0)
	    ret = res;
    }
    globfree(&globbuf);

    xmlFreeDoc(xpathDocument);
    return(ret);
}